

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O0

int Cec_ManSeqSemiformal(Gia_Man_t *pAig,Cec_ParSmf_t *pPars)

{
  Gia_Man_t *pAig_00;
  Vec_Str_t *vPatts;
  Vec_Ptr_t *pPars_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  int local_94;
  int nNonConsts;
  int RetValue;
  int nPats;
  int r;
  Gia_Man_t *pAux;
  Gia_Man_t *pReduce;
  Gia_Man_t *pSrm;
  Abc_Cex_t *pState;
  Vec_Str_t *vStatus;
  Vec_Ptr_t *vSimInfo;
  Cec_ParSat_t *pParsSat;
  Cec_ParSat_t ParsSat;
  int nFramesReal;
  int nCountNoRef;
  int nAddFrames;
  Cec_ParSmf_t *pPars_local;
  Gia_Man_t *pAig_local;
  
  ParsSat.fVerbose = 0;
  vSimInfo = (Vec_Ptr_t *)&pParsSat;
  local_94 = 0;
  if (pAig->pReprs == (Gia_Rpr_t *)0x0) {
    Abc_Print(1,"Cec_ManSeqSemiformal(): Equivalence classes are not available.\n");
    pAig_local._4_4_ = -1;
  }
  else {
    iVar1 = Gia_ManRegNum(pAig);
    if (iVar1 == 0) {
      Abc_Print(1,"Cec_ManSeqSemiformal(): Not a sequential AIG.\n");
      pAig_local._4_4_ = -1;
    }
    else {
      Gia_ManRandom(1);
      iVar1 = Gia_ManRegNum(pAig);
      pSrm = (Gia_Man_t *)Abc_CexAlloc(iVar1,0,0);
      *(int *)((long)&pSrm->pName + 4) = -1;
      *(int *)&pSrm->pName = -1;
      Cec_ManSatSetDefaultParams((Cec_ParSat_t *)vSimInfo);
      vSimInfo->nCap = pPars->nBTLimit;
      vSimInfo[2].nCap = pPars->fVerbose;
      if (vSimInfo[2].nCap != 0) {
        Abc_Print(1,"Starting: ");
        Gia_ManEquivPrintClasses(pAig,0,0.0);
      }
      Gia_ManCleanMark0(pAig);
      for (RetValue = 0; RetValue < pPars->nRounds; RetValue = RetValue + 1) {
        iVar1 = Cec_ManCheckNonTrivialCands(pAig);
        if (iVar1 == 0) {
          Abc_Print(1,
                    "Cec_ManSeqSemiformal: There are only trivial equiv candidates left (PO drivers). Quitting.\n"
                   );
          break;
        }
        pReduce = Gia_ManSpecReduceInitFrames
                            (pAig,(Abc_Cex_t *)pSrm,pPars->nFrames,&ParsSat.fSaveCexes,
                             pPars->fDualOut,pPars->nMinOutputs);
        if (pReduce == (Gia_Man_t *)0x0) {
          Abc_Print(1,"Quitting refinement because miter could not be unrolled.\n");
          break;
        }
        iVar1 = Gia_ManRegNum(pReduce);
        if (iVar1 != 0) {
LAB_00803052:
          __assert_fail("Gia_ManRegNum(pSrm) == 0 && Gia_ManPiNum(pSrm) == (Gia_ManPiNum(pAig) * nFramesReal)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSeq.c"
                        ,0x17d,"int Cec_ManSeqSemiformal(Gia_Man_t *, Cec_ParSmf_t *)");
        }
        iVar1 = Gia_ManPiNum(pReduce);
        iVar2 = Gia_ManPiNum(pAig);
        if (iVar1 != iVar2 * ParsSat.fSaveCexes) goto LAB_00803052;
        if (pPars->fVerbose != 0) {
          Abc_Print(1,"Unrolled for %d frames.\n",(ulong)(uint)ParsSat.fSaveCexes);
        }
        iVar1 = Gia_ManRegNum(pAig);
        iVar2 = Gia_ManPiNum(pAig);
        vStatus = (Vec_Str_t *)
                  Vec_PtrAllocSimInfo(iVar1 + iVar2 * (ParsSat.fSaveCexes + 0x10),pPars->nWords);
        Cec_ManSeqDeriveInfoInitRandom((Vec_Ptr_t *)vStatus,pAig,(Abc_Cex_t *)pSrm);
        pPars_00 = vSimInfo;
        vPatts = vStatus;
        pAig_00 = pReduce;
        iVar1 = Gia_ManRegNum(pAig);
        pState = (Abc_Cex_t *)
                 Cec_ManSatSolveSeq((Vec_Ptr_t *)vPatts,pAig_00,(Cec_ParSat_t *)pPars_00,iVar1,
                                    &nNonConsts);
        Vec_StrFree((Vec_Str_t *)pState);
        Gia_ManStop(pReduce);
        local_94 = Cec_ManSeqResimulateInfo
                             (pAig,(Vec_Ptr_t *)vStatus,(Abc_Cex_t *)pSrm,pPars->fCheckMiter);
        Vec_PtrFree((Vec_Ptr_t *)vStatus);
        if (*(int *)&pSrm->pName < 0) {
          __assert_fail("pState->iPo >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSeq.c"
                        ,0x18b,"int Cec_ManSeqSemiformal(Gia_Man_t *, Cec_ParSmf_t *)");
        }
        *(undefined4 *)&pSrm->pName = 0xffffffff;
        if (pPars->fVerbose != 0) {
          Abc_Print(1,"BMC = %3d ",(ulong)(uint)nNonConsts);
          Gia_ManEquivPrintClasses(pAig,0,0.0);
        }
        Gia_AigerWrite(pAig,"gore.aig",0,0,0);
        pAux = Gia_ManSpecReduce(pAig,0,0,1,0,0);
        if (pAux != (Gia_Man_t *)0x0) {
          _nPats = pAux;
          pAux = Gia_ManSeqStructSweep(pAux,1,1,0);
          Gia_ManStop(_nPats);
          Gia_AigerWrite(pAux,"gsrm.aig",0,0,0);
          Gia_ManStop(pAux);
        }
        if (local_94 != 0) {
          Abc_Print(1,
                    "Cec_ManSeqSemiformal(): An output of the miter is asserted. Refinement stopped.\n"
                   );
          break;
        }
        if (nNonConsts < 1) {
          ParsSat.fVerbose = ParsSat.fVerbose + 1;
          if (ParsSat.fVerbose == pPars->nNonRefines) break;
        }
        else {
          ParsSat.fVerbose = 0;
        }
      }
      if (pSrm != (Gia_Man_t *)0x0) {
        free(pSrm);
        pSrm = (Gia_Man_t *)0x0;
      }
      if ((pPars->fCheckMiter != 0) && (uVar3 = Cec_ManCountNonConstOutputs(pAig), uVar3 != 0)) {
        Abc_Print(1,"The number of POs that are not const-0 candidates = %d.\n",(ulong)uVar3);
      }
      pAig_local._4_4_ = local_94;
    }
  }
  return pAig_local._4_4_;
}

Assistant:

int Cec_ManSeqSemiformal( Gia_Man_t * pAig, Cec_ParSmf_t * pPars )
{ 
    int nAddFrames = 16; // additional timeframes to simulate
    int nCountNoRef = 0;
    int nFramesReal;
    Cec_ParSat_t ParsSat, * pParsSat = &ParsSat;
    Vec_Ptr_t * vSimInfo; 
    Vec_Str_t * vStatus;
    Abc_Cex_t * pState;
    Gia_Man_t * pSrm, * pReduce, * pAux;
    int r, nPats, RetValue = 0;
    if ( pAig->pReprs == NULL )
    { 
        Abc_Print( 1, "Cec_ManSeqSemiformal(): Equivalence classes are not available.\n" );
        return -1;
    }
    if ( Gia_ManRegNum(pAig) == 0 )
    {
        Abc_Print( 1, "Cec_ManSeqSemiformal(): Not a sequential AIG.\n" );
        return -1;
    }
    Gia_ManRandom( 1 );
    // prepare starting pattern
    pState = Abc_CexAlloc( Gia_ManRegNum(pAig), 0, 0 );
    pState->iFrame = -1;
    pState->iPo = -1;
    // prepare SAT solving
    Cec_ManSatSetDefaultParams( pParsSat );
    pParsSat->nBTLimit = pPars->nBTLimit;
    pParsSat->fVerbose = pPars->fVerbose;
    if ( pParsSat->fVerbose )
    {
        Abc_Print( 1, "Starting: " );
        Gia_ManEquivPrintClasses( pAig, 0, 0 );
    }
    // perform the given number of BMC rounds
    Gia_ManCleanMark0( pAig );
    for ( r = 0; r < pPars->nRounds; r++ )
    {
        if ( !Cec_ManCheckNonTrivialCands(pAig) )
        {
            Abc_Print( 1, "Cec_ManSeqSemiformal: There are only trivial equiv candidates left (PO drivers). Quitting.\n" );
            break;
        }
//        Abc_CexPrint( pState );
        // derive speculatively reduced model
//        pSrm = Gia_ManSpecReduceInit( pAig, pState, pPars->nFrames, pPars->fDualOut );
        pSrm = Gia_ManSpecReduceInitFrames( pAig, pState, pPars->nFrames, &nFramesReal, pPars->fDualOut, pPars->nMinOutputs );
        if ( pSrm == NULL )
        {
            Abc_Print( 1, "Quitting refinement because miter could not be unrolled.\n" );
            break;
        }
        assert( Gia_ManRegNum(pSrm) == 0 && Gia_ManPiNum(pSrm) == (Gia_ManPiNum(pAig) * nFramesReal) );
        if ( pPars->fVerbose )
            Abc_Print( 1, "Unrolled for %d frames.\n", nFramesReal );
        // allocate room for simulation info
        vSimInfo = Vec_PtrAllocSimInfo( Gia_ManRegNum(pAig) + 
            Gia_ManPiNum(pAig) * (nFramesReal + nAddFrames), pPars->nWords );
        Cec_ManSeqDeriveInfoInitRandom( vSimInfo, pAig, pState );
        // fill in simulation info with counter-examples
        vStatus = Cec_ManSatSolveSeq( vSimInfo, pSrm, pParsSat, Gia_ManRegNum(pAig), &nPats );
        Vec_StrFree( vStatus );
        Gia_ManStop( pSrm );
        // resimulate and refine the classes
        RetValue = Cec_ManSeqResimulateInfo( pAig, vSimInfo, pState, pPars->fCheckMiter );
        Vec_PtrFree( vSimInfo );
        assert( pState->iPo >= 0 ); // hit counter
        pState->iPo = -1;
        if ( pPars->fVerbose )
        {
            Abc_Print( 1, "BMC = %3d ", nPats );
            Gia_ManEquivPrintClasses( pAig, 0, 0 );
        }

        // write equivalence classes
        Gia_AigerWrite( pAig, "gore.aig", 0, 0, 0 );
        // reduce the model
        pReduce = Gia_ManSpecReduce( pAig, 0, 0, 1, 0, 0 );
        if ( pReduce )
        {
            pReduce = Gia_ManSeqStructSweep( pAux = pReduce, 1, 1, 0 );
            Gia_ManStop( pAux );
            Gia_AigerWrite( pReduce, "gsrm.aig", 0, 0, 0 );
//            Abc_Print( 1, "Speculatively reduced model was written into file \"%s\".\n", "gsrm.aig" );
//          Gia_ManPrintStatsShort( pReduce );
            Gia_ManStop( pReduce );
        }

        if ( RetValue )
        {
            Abc_Print( 1, "Cec_ManSeqSemiformal(): An output of the miter is asserted. Refinement stopped.\n" );
            break;
        }
        // decide when to stop
        if ( nPats > 0 )
            nCountNoRef = 0;
        else if ( ++nCountNoRef == pPars->nNonRefines )
            break;
    }
    ABC_FREE( pState );
    if ( pPars->fCheckMiter )
    {
        int nNonConsts = Cec_ManCountNonConstOutputs( pAig );
        if ( nNonConsts )
            Abc_Print( 1, "The number of POs that are not const-0 candidates = %d.\n", nNonConsts );
    }
    return RetValue;
}